

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v1.cpp
# Opt level: O0

ssize_t __thiscall
LASreadItemCompressed_POINT10_v1::read
          (LASreadItemCompressed_POINT10_v1 *this,int __fd,void *__buf,size_t __nbytes)

{
  I32 IVar1;
  U32 UVar2;
  I32 IVar3;
  U32 UVar4;
  I32 IVar5;
  ArithmeticModel *pAVar6;
  uint uVar7;
  undefined4 in_register_00000034;
  undefined8 *puVar8;
  U32 local_68;
  U32 local_54;
  I32 changed_values;
  I32 y_diff;
  U32 k_bits;
  I32 x_diff;
  I32 median_y;
  I32 median_x;
  U32 *context_local;
  U8 *item_local;
  LASreadItemCompressed_POINT10_v1 *this_local;
  
  puVar8 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  if (this->last_x_diff[0] < this->last_x_diff[1]) {
    if (this->last_x_diff[1] < this->last_x_diff[2]) {
      x_diff = this->last_x_diff[1];
    }
    else if (this->last_x_diff[0] < this->last_x_diff[2]) {
      x_diff = this->last_x_diff[2];
    }
    else {
      x_diff = this->last_x_diff[0];
    }
  }
  else if (this->last_x_diff[0] < this->last_x_diff[2]) {
    x_diff = this->last_x_diff[0];
  }
  else if (this->last_x_diff[1] < this->last_x_diff[2]) {
    x_diff = this->last_x_diff[2];
  }
  else {
    x_diff = this->last_x_diff[1];
  }
  if (this->last_y_diff[0] < this->last_y_diff[1]) {
    if (this->last_y_diff[1] < this->last_y_diff[2]) {
      k_bits = this->last_y_diff[1];
    }
    else if (this->last_y_diff[0] < this->last_y_diff[2]) {
      k_bits = this->last_y_diff[2];
    }
    else {
      k_bits = this->last_y_diff[0];
    }
  }
  else if (this->last_y_diff[0] < this->last_y_diff[2]) {
    k_bits = this->last_y_diff[0];
  }
  else if (this->last_y_diff[1] < this->last_y_diff[2]) {
    k_bits = this->last_y_diff[2];
  }
  else {
    k_bits = this->last_y_diff[1];
  }
  IVar1 = IntegerCompressor::decompress(this->ic_dx,x_diff,0);
  *(I32 *)this->last_item = IVar1 + *(int *)this->last_item;
  UVar2 = IntegerCompressor::getK(this->ic_dx);
  local_54 = UVar2;
  if (0x12 < UVar2) {
    local_54 = 0x13;
  }
  IVar3 = IntegerCompressor::decompress(this->ic_dy,k_bits,local_54);
  *(I32 *)(this->last_item + 4) = IVar3 + *(int *)(this->last_item + 4);
  UVar4 = IntegerCompressor::getK(this->ic_dy);
  uVar7 = UVar2 + UVar4 >> 1;
  local_68 = uVar7;
  if (0x12 < uVar7) {
    local_68 = 0x13;
  }
  IVar5 = IntegerCompressor::decompress(this->ic_z,*(I32 *)(this->last_item + 8),local_68);
  *(I32 *)(this->last_item + 8) = IVar5;
  UVar2 = ArithmeticDecoder::decodeSymbol(this->dec,this->m_changed_values);
  if (UVar2 != 0) {
    if ((UVar2 & 0x20) != 0) {
      IVar5 = IntegerCompressor::decompress
                        (this->ic_intensity,(uint)*(ushort *)(this->last_item + 0xc),0);
      *(short *)(this->last_item + 0xc) = (short)IVar5;
    }
    if ((UVar2 & 0x10) != 0) {
      if (this->m_bit_byte[this->last_item[0xe]] == (ArithmeticModel *)0x0) {
        pAVar6 = ArithmeticDecoder::createSymbolModel(this->dec,0x100);
        this->m_bit_byte[this->last_item[0xe]] = pAVar6;
        ArithmeticDecoder::initSymbolModel
                  (this->dec,this->m_bit_byte[this->last_item[0xe]],(U32 *)0x0);
      }
      UVar4 = ArithmeticDecoder::decodeSymbol(this->dec,this->m_bit_byte[this->last_item[0xe]]);
      this->last_item[0xe] = (U8)UVar4;
    }
    if ((UVar2 & 8) != 0) {
      if (this->m_classification[this->last_item[0xf]] == (ArithmeticModel *)0x0) {
        pAVar6 = ArithmeticDecoder::createSymbolModel(this->dec,0x100);
        this->m_classification[this->last_item[0xf]] = pAVar6;
        ArithmeticDecoder::initSymbolModel
                  (this->dec,this->m_classification[this->last_item[0xf]],(U32 *)0x0);
      }
      UVar4 = ArithmeticDecoder::decodeSymbol
                        (this->dec,this->m_classification[this->last_item[0xf]]);
      this->last_item[0xf] = (U8)UVar4;
    }
    if ((UVar2 & 4) != 0) {
      IVar5 = IntegerCompressor::decompress
                        (this->ic_scan_angle_rank,(uint)this->last_item[0x10],(uint)(uVar7 < 3));
      this->last_item[0x10] = (U8)IVar5;
    }
    if ((UVar2 & 2) != 0) {
      if (this->m_user_data[this->last_item[0x11]] == (ArithmeticModel *)0x0) {
        pAVar6 = ArithmeticDecoder::createSymbolModel(this->dec,0x100);
        this->m_user_data[this->last_item[0x11]] = pAVar6;
        ArithmeticDecoder::initSymbolModel
                  (this->dec,this->m_user_data[this->last_item[0x11]],(U32 *)0x0);
      }
      UVar4 = ArithmeticDecoder::decodeSymbol(this->dec,this->m_user_data[this->last_item[0x11]]);
      this->last_item[0x11] = (U8)UVar4;
    }
    if ((UVar2 & 1) != 0) {
      IVar5 = IntegerCompressor::decompress
                        (this->ic_point_source_ID,(uint)*(ushort *)(this->last_item + 0x12),0);
      *(short *)(this->last_item + 0x12) = (short)IVar5;
    }
  }
  this->last_x_diff[this->last_incr] = IVar1;
  this->last_y_diff[this->last_incr] = IVar3;
  this->last_incr = this->last_incr + 1;
  if (2 < this->last_incr) {
    this->last_incr = 0;
  }
  *puVar8 = *(undefined8 *)this->last_item;
  puVar8[1] = *(undefined8 *)(this->last_item + 8);
  *(undefined4 *)(puVar8 + 2) = *(undefined4 *)(this->last_item + 0x10);
  return (ssize_t)puVar8;
}

Assistant:

inline void LASreadItemCompressed_POINT10_v1::read(U8* item, U32& context)
{
  // find median difference for x and y from 3 preceding differences
  I32 median_x;
  if (last_x_diff[0] < last_x_diff[1])
  {
    if (last_x_diff[1] < last_x_diff[2])
      median_x = last_x_diff[1];
    else if (last_x_diff[0] < last_x_diff[2])
      median_x = last_x_diff[2];
    else
      median_x = last_x_diff[0];
  }
  else
  {
    if (last_x_diff[0] < last_x_diff[2])
      median_x = last_x_diff[0];
    else if (last_x_diff[1] < last_x_diff[2])
      median_x = last_x_diff[2];
    else
      median_x = last_x_diff[1];
  }

  I32 median_y;
  if (last_y_diff[0] < last_y_diff[1])
  {
    if (last_y_diff[1] < last_y_diff[2])
      median_y = last_y_diff[1];
    else if (last_y_diff[0] < last_y_diff[2])
      median_y = last_y_diff[2];
    else
      median_y = last_y_diff[0];
  }
  else
  {
    if (last_y_diff[0] < last_y_diff[2])
      median_y = last_y_diff[0];
    else if (last_y_diff[1] < last_y_diff[2])
      median_y = last_y_diff[2];
    else
      median_y = last_y_diff[1];
  }

  // decompress x y z coordinates
  I32 x_diff = ic_dx->decompress(median_x);
  ((LASpoint10*)last_item)->x += x_diff;
  // we use the number k of bits corrector bits to switch contexts
  U32 k_bits = ic_dx->getK();
  I32 y_diff = ic_dy->decompress(median_y, (k_bits < 19 ? k_bits : 19));
  ((LASpoint10*)last_item)->y += y_diff;
  k_bits = (k_bits + ic_dy->getK())/2;
  ((LASpoint10*)last_item)->z = ic_z->decompress(((LASpoint10*)last_item)->z, (k_bits < 19 ? k_bits : 19));

  // decompress which other values have changed
  I32 changed_values = dec->decodeSymbol(m_changed_values);

  if (changed_values)
  {
    // decompress the intensity if it has changed
    if (changed_values & 32)
    {
      ((LASpoint10*)last_item)->intensity = (U16)ic_intensity->decompress(((LASpoint10*)last_item)->intensity);
    }

    // decompress the edge_of_flight_line, scan_direction_flag, ... if it has changed
    if (changed_values & 16)
    {
      if (m_bit_byte[last_item[14]] == 0)
      {
        m_bit_byte[last_item[14]] = dec->createSymbolModel(256);
        dec->initSymbolModel(m_bit_byte[last_item[14]]);
      }
      last_item[14] = (U8)dec->decodeSymbol(m_bit_byte[last_item[14]]);
    }

    // decompress the classification ... if it has changed
    if (changed_values & 8)
    {
      if (m_classification[last_item[15]] == 0)
      {
        m_classification[last_item[15]] = dec->createSymbolModel(256);
        dec->initSymbolModel(m_classification[last_item[15]]);
      }
      last_item[15] = (U8)dec->decodeSymbol(m_classification[last_item[15]]);
    }
    
    // decompress the scan_angle_rank ... if it has changed
    if (changed_values & 4)
    {
      last_item[16] = (U8)ic_scan_angle_rank->decompress(last_item[16], k_bits < 3);
    }

    // decompress the user_data ... if it has changed
    if (changed_values & 2)
    {
      if (m_user_data[last_item[17]] == 0)
      {
        m_user_data[last_item[17]] = dec->createSymbolModel(256);
        dec->initSymbolModel(m_user_data[last_item[17]]);
      }
      last_item[17] = (U8)dec->decodeSymbol(m_user_data[last_item[17]]);
    }

    // decompress the point_source_ID ... if it has changed
    if (changed_values & 1)
    {
      ((LASpoint10*)last_item)->point_source_ID = (U16)ic_point_source_ID->decompress(((LASpoint10*)last_item)->point_source_ID);
    }
  }

  // record the difference
  last_x_diff[last_incr] = x_diff;
  last_y_diff[last_incr] = y_diff;
  last_incr++;
  if (last_incr > 2) last_incr = 0;

  // copy the last point
  memcpy(item, last_item, 20);
}